

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::CordOutputStream::BackUp(CordOutputStream *this,int count)

{
  int64_t iVar1;
  size_t sVar2;
  
  if (-1 < count) {
    iVar1 = ByteCount(this);
    if ((long)(ulong)(uint)count <= iVar1) {
      if (count != 0) {
        sVar2 = absl::lts_20240722::CordBuffer::length(&this->buffer_);
        if ((int)sVar2 < count) {
          __assert_fail("count <= buffer_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                        ,0x28e,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
        }
        absl::lts_20240722::CordBuffer::SetLength(&this->buffer_,(long)((int)sVar2 - count));
        this->state_ = kPartial;
      }
      return;
    }
  }
  __assert_fail("0 <= count && count <= ByteCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x289,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
}

Assistant:

void CordOutputStream::BackUp(int count) {
  // Check if something to do, else state remains unchanged.
  assert(0 <= count && count <= ByteCount());
  if (count == 0) return;

  // Backup() is not supposed to backup beyond last Next() call
  const int buffer_length = static_cast<int>(buffer_.length());
  assert(count <= buffer_length);
  if (count <= buffer_length) {
    buffer_.SetLength(static_cast<size_t>(buffer_length - count));
    state_ = State::kPartial;
  } else {
    buffer_ = {};
    cord_.RemoveSuffix(static_cast<size_t>(count));
    state_ = State::kSteal;
  }
}